

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O0

void __thiscall Memory::LargeHeapBucket::Verify(LargeHeapBucket *this)

{
  anon_class_8_1_b8cf05bd fn;
  Recycler *recycler;
  LargeHeapBucket *this_local;
  
  fn.recycler = ((this->super_HeapBucket).heapInfo)->recycler;
  HeapBlockList::ForEach<Memory::LargeHeapBlock,Memory::LargeHeapBucket::Verify()::__0>
            (this->largeBlockList,fn);
  HeapBlockList::ForEach<Memory::LargeHeapBlock,Memory::LargeHeapBucket::Verify()::__1>
            (this->largePageHeapBlockList,fn);
  HeapBlockList::ForEach<Memory::LargeHeapBlock,Memory::LargeHeapBucket::Verify()::__2>
            (this->fullLargeBlockList,fn);
  HeapBlockList::ForEach<Memory::LargeHeapBlock,Memory::LargeHeapBucket::Verify()::__3>
            (this->pendingDisposeLargeBlockList,fn);
  return;
}

Assistant:

void
LargeHeapBucket::Verify()
{
    Recycler * recycler = this->heapInfo->recycler;
    HeapBlockList::ForEach(largeBlockList, [recycler](LargeHeapBlock * largeHeapBlock)
    {
        largeHeapBlock->Verify(recycler);
    });
#ifdef RECYCLER_PAGE_HEAP
    HeapBlockList::ForEach(largePageHeapBlockList, [recycler](LargeHeapBlock * largeHeapBlock)
    {
        largeHeapBlock->Verify(recycler);
    });
#endif
    HeapBlockList::ForEach(fullLargeBlockList, [recycler](LargeHeapBlock * largeHeapBlock)
    {
        largeHeapBlock->Verify(recycler);
    });
    HeapBlockList::ForEach(pendingDisposeLargeBlockList, [recycler](LargeHeapBlock * largeHeapBlock)
    {
        largeHeapBlock->Verify(recycler);
    });
}